

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcamera.h
# Opt level: O2

void CameraMoveUp(Camera *camera,float distance)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Vector3 VVar8;
  
  VVar8 = GetCameraUp(camera);
  fVar5 = VVar8.z * distance;
  fVar6 = distance * VVar8.x;
  fVar7 = distance * VVar8.y;
  uVar1 = (camera->position).x;
  uVar3 = (camera->position).y;
  uVar2 = (camera->target).x;
  uVar4 = (camera->target).y;
  (camera->position).x = (float)uVar1 + fVar6;
  (camera->position).y = (float)uVar3 + fVar7;
  (camera->position).z = (camera->position).z + fVar5;
  (camera->target).x = (float)uVar2 + fVar6;
  (camera->target).y = (float)uVar4 + fVar7;
  (camera->target).z = fVar5 + (camera->target).z;
  return;
}

Assistant:

void CameraMoveUp(Camera *camera, float distance)
{
    Vector3 up = GetCameraUp(camera);

    // Scale by distance
    up = Vector3Scale(up, distance);

    // Move position and target
    camera->position = Vector3Add(camera->position, up);
    camera->target = Vector3Add(camera->target, up);
}